

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::Cord::PrependArray(Cord *this,string_view src,MethodIdentifier method)

{
  ulong uVar1;
  CordRep *pCVar2;
  Nullable<CordRep_*> tree;
  Nullable<const_char_*> data_00;
  Nullable<const_char_*> alloc_hint;
  Nullable<const_char_*> extraout_RDX;
  size_t __n;
  ulong uVar3;
  InlineData data;
  undefined8 local_48;
  CordRep *pCStack_40;
  
  data_00 = src._M_str;
  __n = src._M_len;
  pCVar2 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  alloc_hint = data_00;
  if ((pCVar2 != (CordRep *)0x0 && ((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) &&
     (pCVar2->length == 0)) {
    PrependArray();
    alloc_hint = extraout_RDX;
  }
  if (__n == 0) {
    return;
  }
  uVar3 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
  if ((uVar3 & 1) == 0) {
    uVar3 = uVar3 >> 1;
    uVar1 = uVar3 + __n;
    if (uVar1 < 0x10) {
      pCStack_40 = (CordRep *)0x0;
      local_48 = (ulong)(byte)((char)uVar1 * '\x02');
      memcpy((void *)((long)&local_48 + 1),data_00,__n);
      memcpy((void *)((long)&local_48 + __n + 1),
             (void *)((long)&(this->contents_).data_.rep_.field_0 + 1),uVar3);
      *(ulong *)&(this->contents_).data_.rep_.field_0 = local_48;
      (this->contents_).data_.rep_.field_0.as_tree.rep = pCStack_40;
      return;
    }
  }
  tree = NewTree(data_00,__n,(size_t)alloc_hint);
  InlineRep::PrependTree(&this->contents_,tree,method);
  return;
}

Assistant:

void Cord::PrependArray(absl::string_view src, MethodIdentifier method) {
  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;  // memcpy(_, nullptr, 0) is undefined.

  if (!contents_.is_tree()) {
    size_t cur_size = contents_.inline_size();
    if (cur_size + src.size() <= InlineRep::kMaxInline) {
      // Use embedded storage.
      InlineData data;
      data.set_inline_size(cur_size + src.size());
      memcpy(data.as_chars(), src.data(), src.size());
      memcpy(data.as_chars() + src.size(), contents_.data(), cur_size);
      contents_.data_ = data;
      return;
    }
  }
  CordRep* rep = NewTree(src.data(), src.size(), 0);
  contents_.PrependTree(rep, method);
}